

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockd.h
# Opt level: O0

TX_SIZE av1_get_tx_size(int plane,MACROBLOCKD *xd)

{
  long lVar1;
  long in_RSI;
  int in_EDI;
  MACROBLOCKD_PLANE *pd;
  MB_MODE_INFO *mbmi;
  int in_stack_ffffffffffffffdc;
  undefined1 local_1;
  
  if (*(int *)(in_RSI + 0x29c4 +
              (ulong)((byte)*(undefined2 *)(**(long **)(in_RSI + 0x1eb8) + 0xa7) & 7) * 4) == 0) {
    if (in_EDI == 0) {
      local_1 = *(TX_SIZE *)(**(long **)(in_RSI + 0x1eb8) + 0x91);
    }
    else {
      lVar1 = in_RSI + 0x10 + (long)in_EDI * 0xa30;
      local_1 = av1_get_max_uv_txsize
                          ((BLOCK_SIZE)((ulong)lVar1 >> 0x38),(int)lVar1,in_stack_ffffffffffffffdc);
    }
  }
  else {
    local_1 = '\0';
  }
  return local_1;
}

Assistant:

static inline TX_SIZE av1_get_tx_size(int plane, const MACROBLOCKD *xd) {
  const MB_MODE_INFO *mbmi = xd->mi[0];
  if (xd->lossless[mbmi->segment_id]) return TX_4X4;
  if (plane == 0) return mbmi->tx_size;
  const MACROBLOCKD_PLANE *pd = &xd->plane[plane];
  return av1_get_max_uv_txsize(mbmi->bsize, pd->subsampling_x,
                               pd->subsampling_y);
}